

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O3

bool operator<(summary_period *lhs,summary_period *rhs)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  iVar1 = rhs->summary_id;
  iVar2 = lhs->summary_id;
  bVar4 = SBORROW4(iVar2,iVar1);
  bVar3 = iVar2 - iVar1 < 0;
  if (iVar2 == iVar1) {
    iVar1 = rhs->period_no;
    iVar2 = lhs->period_no;
    bVar4 = SBORROW4(iVar2,iVar1);
    bVar3 = iVar2 - iVar1 < 0;
    if (iVar2 == iVar1) {
      bVar4 = SBORROW4(lhs->fileindex,rhs->fileindex);
      bVar3 = lhs->fileindex - rhs->fileindex < 0;
    }
  }
  return bVar4 != bVar3;
}

Assistant:

bool operator<(const summary_period &lhs, const summary_period &rhs) {

	if (lhs.summary_id != rhs.summary_id) {
		return lhs.summary_id < rhs.summary_id;
	} else if (lhs.period_no != rhs.period_no) {
		return lhs.period_no < rhs.period_no;
	} else {
		return lhs.fileindex < rhs.fileindex;
	}

}